

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::computeResOfCorrection(MLMG *this,int amrlev,int mglev)

{
  Any *pAVar1;
  Any *pAVar2;
  Any *pAVar3;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  Any *r;
  Any *b;
  Any *x;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *in_stack_ffffffffffffffc0;
  
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  pAVar1 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffffc0,
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  pAVar2 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffffc0,
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                *)in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  pAVar3 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     (in_stack_ffffffffffffffc0,
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  (**(code **)(**(long **)(in_RDI + 0x48) + 0x1a8))
            (*(long **)(in_RDI + 0x48),in_ESI,in_EDX,pAVar3,pAVar1,pAVar2,0,0);
  return;
}

Assistant:

void
MLMG::computeResOfCorrection (int amrlev, int mglev)
{
    BL_PROFILE("MLMG:computeResOfCorrection()");
    Any      & x =    cor[amrlev][mglev];
    const Any& b =    res[amrlev][mglev];
    Any      & r = rescor[amrlev][mglev];
    linop.AnyCorrectionResidual(amrlev, mglev, r, x, b, BCMode::Homogeneous);
}